

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_process_window_update_frame(nghttp2_session *session)

{
  int iVar1;
  
  nghttp2_frame_unpack_window_update_payload
            ((nghttp2_window_update *)&session->iframe,(session->iframe).sbuf.pos);
  iVar1 = nghttp2_session_on_window_update_received(session,&(session->iframe).frame);
  return iVar1;
}

Assistant:

static int session_process_window_update_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  nghttp2_frame_unpack_window_update_payload(&frame->window_update,
                                             iframe->sbuf.pos);

  return nghttp2_session_on_window_update_received(session, frame);
}